

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O2

Sexp * __thiscall GcHeap::GcHeapImpl::Allocate(GcHeapImpl *this,bool should_finalize)

{
  Sexp *pSVar1;
  Sexp *pSVar2;
  Sexp *local_30;
  
  SignalContractViolation(NoGc,"Allocate");
  pSVar2 = (Sexp *)this->free;
  pSVar1 = pSVar2 + 1;
  if (((Sexp *)this->top < pSVar1) || (this->stress == true)) {
    DebugLog("bump pointer alloc failed, triggering a GC");
    Collect(this);
    pSVar2 = (Sexp *)this->free;
    pSVar1 = pSVar2 + 1;
    if ((Sexp *)this->top < pSVar1) {
      PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,200,"Allocate","out of memory!");
    }
  }
  DebugLog("allocated object at %p, new bump at %p",pSVar2,pSVar1);
  this->free = (uint8_t *)pSVar1;
  (pSVar2->field_1).cons.cdr = (Sexp *)0x0;
  pSVar2->padding = 0;
  *(undefined8 *)pSVar2 = 0;
  (pSVar2->field_1).cons.car = (Sexp *)0x0;
  if (should_finalize) {
    DebugLog("marking object %p for finalization",pSVar2);
    local_30 = pSVar2;
    std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::push_back(&this->finalize_queue,&local_30);
  }
  return pSVar2;
}

Assistant:

Sexp *Allocate(bool should_finalize) {
    // on a debug build, this triggers a stackwalk which will assert if
    // any of the calling functions has a FORBID_GC contract.
    CONTRACT_VIOLATIONS { PERFORMS_GC; }